

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void av1_compute_stats_highbd_c
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  int32_t *piVar6;
  long lVar7;
  int64_t *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ushort *puVar16;
  ushort *puVar17;
  ushort *puVar18;
  ulong uVar19;
  long *plVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ushort *local_148;
  ushort local_140;
  int32_t Y [49];
  
  lVar15 = (long)dgd_stride;
  lVar3 = (long)h_start;
  lVar9 = (long)v_start;
  lVar7 = lVar15 * lVar9 * 2 + (long)dgd8 * 2;
  uVar2 = 0;
  for (lVar10 = lVar9; lVar5 = lVar3, lVar10 < v_end; lVar10 = lVar10 + 1) {
    for (; lVar5 < h_end; lVar5 = lVar5 + 1) {
      uVar2 = uVar2 + *(ushort *)(lVar7 + lVar5 * 2);
    }
    lVar7 = lVar7 + lVar15 * 2;
  }
  uVar2 = uVar2 / (ulong)(long)((h_end - h_start) * (v_end - v_start));
  uVar23 = (ulong)(uint)(wiener_win * wiener_win);
  memset(M,0,uVar23 * 8);
  memset(H,0,uVar23 * 8 * uVar23);
  local_140 = (ushort)uVar2;
  lVar7 = (long)(wiener_win >> 1);
  uVar4 = wiener_win | 1;
  local_148 = (ushort *)((long)dgd8 * 2 + lVar3 * 2 + (lVar9 - lVar7) * lVar15 * 2 + lVar7 * -2);
  for (; lVar9 < v_end; lVar9 = lVar9 + 1) {
    puVar17 = local_148;
    for (lVar10 = lVar3; lVar10 < h_end; lVar10 = lVar10 + 1) {
      uVar1 = *(ushort *)((long)src8 * 2 + lVar9 * src_stride * 2 + lVar10 * 2);
      puVar18 = puVar17;
      uVar21 = uVar4;
      iVar13 = 0;
      for (lVar5 = (long)-(wiener_win >> 1); lVar5 <= lVar7; lVar5 = lVar5 + 1) {
        puVar16 = puVar18;
        for (lVar11 = (long)iVar13; (int)uVar21 != lVar11; lVar11 = lVar11 + 1) {
          Y[lVar11] = (uint)*puVar16 - (uint)local_140;
          puVar16 = puVar16 + lVar15;
        }
        uVar21 = uVar21 + uVar4;
        puVar18 = puVar18 + 1;
        iVar13 = iVar13 + uVar4;
      }
      piVar6 = Y;
      uVar14 = uVar23;
      piVar8 = H;
      for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
        iVar13 = Y[uVar22];
        M[uVar22] = M[uVar22] + (long)iVar13 * ((ulong)uVar1 - (uVar2 & 0xffff));
        for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
          piVar8[uVar19] = piVar8[uVar19] + (long)piVar6[uVar19] * (long)iVar13;
        }
        piVar8 = piVar8 + uVar23 + 1;
        uVar14 = uVar14 - 1;
        piVar6 = piVar6 + 1;
      }
      puVar17 = puVar17 + 1;
    }
    local_148 = local_148 + lVar15;
  }
  lVar7 = 0x10;
  if (bit_depth != AOM_BITS_12) {
    lVar7 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
  }
  piVar8 = H + 1;
  plVar12 = H + uVar23;
  lVar10 = 1;
  for (uVar2 = 0; uVar2 != uVar23; uVar2 = uVar2 + 1) {
    M[uVar2] = M[uVar2] / lVar7;
    H[uVar2 * uVar23 + uVar2] = H[uVar2 * uVar23 + uVar2] / lVar7;
    plVar20 = plVar12;
    for (lVar3 = 0; (ulong)(lVar10 + lVar3) < uVar23; lVar3 = lVar3 + 1) {
      lVar9 = piVar8[lVar3];
      piVar8[lVar3] = lVar9 / lVar7;
      *plVar20 = lVar9 / lVar7;
      plVar20 = plVar20 + uVar23;
    }
    lVar10 = lVar10 + 1;
    piVar8 = piVar8 + uVar23 + 1;
    plVar12 = plVar12 + uVar23 + 1;
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_c(int wiener_win, const uint8_t *dgd8,
                                const uint8_t *src8, int16_t *dgd_avg,
                                int16_t *src_avg, int h_start, int h_end,
                                int v_start, int v_end, int dgd_stride,
                                int src_stride, int64_t *M, int64_t *H,
                                aom_bit_depth_t bit_depth) {
  (void)dgd_avg;
  (void)src_avg;
  int i, j, k, l;
  int32_t Y[WIENER_WIN2];
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);
  for (i = v_start; i < v_end; i++) {
    for (j = h_start; j < h_end; j++) {
      const int32_t X = (int32_t)src[i * src_stride + j] - (int32_t)avg;
      int idx = 0;
      for (k = -wiener_halfwin; k <= wiener_halfwin; k++) {
        for (l = -wiener_halfwin; l <= wiener_halfwin; l++) {
          Y[idx] = (int32_t)dgd[(i + l) * dgd_stride + (j + k)] - (int32_t)avg;
          idx++;
        }
      }
      assert(idx == wiener_win2);
      for (k = 0; k < wiener_win2; ++k) {
        M[k] += (int64_t)Y[k] * X;
        for (l = k; l < wiener_win2; ++l) {
          // H is a symmetric matrix, so we only need to fill out the upper
          // triangle here. We can copy it down to the lower triangle outside
          // the (i, j) loops.
          H[k * wiener_win2 + l] += (int64_t)Y[k] * Y[l];
        }
      }
    }
  }
  for (k = 0; k < wiener_win2; ++k) {
    M[k] /= bit_depth_divider;
    H[k * wiener_win2 + k] /= bit_depth_divider;
    for (l = k + 1; l < wiener_win2; ++l) {
      H[k * wiener_win2 + l] /= bit_depth_divider;
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}